

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  color_cluster *this_00;
  color_quad<unsigned_char,_int> *other;
  uint *puVar7;
  ulong uVar8;
  float *pfVar9;
  byte *pbVar10;
  unsigned_long_long *puVar11;
  float fVar12;
  color_quad<unsigned_char,_int> *local_b78;
  color_quad<unsigned_char,_int> *local_b60;
  undefined1 local_b20 [8];
  results refinerResults;
  params refinerParams;
  uint error;
  uint8 s;
  uint8 t;
  uint uStack_acc;
  uint8 s_best;
  uint error_best;
  uint p;
  uint32 selector;
  uint weight;
  uint b;
  uint i_2;
  vector<unsigned_int> *blocks;
  float fStack_aa8;
  uint i_1;
  float encoding_weight [8];
  uint local_a80;
  uint endpoint_weight;
  uint c;
  uint i;
  color_quad_u8 color_values [4];
  color_quad_u8 block_values [4];
  undefined1 local_a50 [8];
  results results;
  params params;
  color_cluster *cluster;
  undefined1 local_9f8 [4];
  uint cluster_index;
  vector<unsigned_char> selectors;
  undefined1 local_9d8 [8];
  dxt_endpoint_refiner refiner;
  dxt1_endpoint_optimizer optimizer;
  uint num_tasks;
  void *param_2_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar3 = task_pool::get_num_threads(this->m_pTask_pool);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer((dxt1_endpoint_optimizer *)&refiner.m_pResults);
  dxt_endpoint_refiner::dxt_endpoint_refiner((dxt_endpoint_refiner *)local_9d8);
  vector<unsigned_char>::vector((vector<unsigned_char> *)local_9f8);
  for (cluster._4_4_ = (uint)data;
      uVar4 = vector<crnlib::dxt_hc::color_cluster>::size(&this->m_color_clusters),
      cluster._4_4_ < uVar4; cluster._4_4_ = uVar3 + 1 + cluster._4_4_) {
    this_00 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                        (&this->m_color_clusters,cluster._4_4_);
    bVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::empty(&this_00->pixels);
    if (!bVar1) {
      dxt1_endpoint_optimizer::params::params((params *)&results.m_alpha_block);
      results.m_alpha_block = (bool)cluster._4_1_;
      results.m_reordered = (bool)cluster._5_1_;
      results.m_alternate_rounding = (bool)cluster._6_1_;
      results.m_enforce_selector = (bool)cluster._7_1_;
      vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&this_00->pixels);
      uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
      dxt1_endpoint_optimizer::results::results((results *)local_a50);
      vector<unsigned_char>::resize((vector<unsigned_char> *)local_9f8,uVar4,false);
      results._8_8_ = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_9f8);
      dxt1_endpoint_optimizer::compute
                ((dxt1_endpoint_optimizer *)&refiner.m_pResults,(params *)&results.m_alpha_block,
                 (results *)local_a50);
      this_00->first_endpoint = (uint)(ushort)results.m_error;
      this_00->second_endpoint = (uint)results.m_error._2_2_;
      local_b60 = color_values + 2;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_b60);
        local_b60 = local_b60 + 1;
      } while (local_b60 != block_values + 2);
      local_b78 = (color_quad<unsigned_char,_int> *)&c;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_b78);
        local_b78 = local_b78 + 1;
      } while (local_b78 != color_values + 2);
      dxt1_block::get_block_colors4
                (color_values + 2,(uint16)this_00->first_endpoint,(uint16)this_00->second_endpoint);
      for (endpoint_weight = 0; endpoint_weight < 4; endpoint_weight = endpoint_weight + 1) {
        other = color_quad<unsigned_char,_int>::operator=
                          (this_00->color_values + endpoint_weight,
                           color_values +
                           (ulong)*(byte *)((long)&g_dxt1_from_linear + (ulong)endpoint_weight) + 2)
        ;
        color_quad<unsigned_char,_int>::operator=
                  ((color_quad<unsigned_char,_int> *)(&c + endpoint_weight),other);
      }
      for (local_a80 = 0; (results.m_pSelectors._2_1_ & 1) != 0 && local_a80 < 3;
          local_a80 = local_a80 + 1) {
        color_values[-1].field_0.c[local_a80] =
             (uchar)((ulong)((uint)*(byte *)((long)&c + (ulong)local_a80) * 2 +
                             (uint)color_values[1].field_0.c[local_a80] + 1) / 3);
        color_values[0].field_0.c[local_a80] =
             (uchar)((ulong)((uint)color_values[1].field_0.c[local_a80] * 2 +
                             (uint)*(byte *)((long)&c + (ulong)local_a80) + 1) / 3);
      }
      uVar4 = crnlib::color::color_distance
                        ((bool)((this->m_params).m_perceptual & 1),(color_quad_u8 *)&c,
                         color_values + 1,false);
      encoding_weight[7] = (float)(uVar4 / 2000);
      for (blocks._4_4_ = 0; blocks._4_4_ < 8; blocks._4_4_ = blocks._4_4_ + 1) {
        fVar12 = math::lerp<float,float>(1.15,1.0,(float)blocks._4_4_ / 7.0);
        (&fStack_aa8)[blocks._4_4_] = fVar12;
      }
      for (weight = 0; uVar4 = vector<unsigned_int>::size(this_00->blocks), weight < uVar4;
          weight = weight + 1) {
        puVar7 = vector<unsigned_int>::operator[](this_00->blocks,weight);
        uVar4 = *puVar7;
        uVar8 = (ulong)(uint)encoding_weight[7];
        pfVar9 = vector<float>::operator[](&this->m_block_weights,uVar4);
        uVar5 = math::clamp<unsigned_int>((uint)(long)((float)uVar8 * *pfVar9),1,0x800);
        pbVar10 = vector<unsigned_char>::operator[](&this->m_block_encodings,uVar4);
        fVar12 = (&fStack_aa8)[*pbVar10];
        error_best = 0;
        for (uStack_acc = 0; uStack_acc < 0x10; uStack_acc = uStack_acc + 1) {
          error = 0xffffffff;
          refinerParams._55_1_ = 0;
          for (refinerParams._54_1_ = 0; (byte)refinerParams._54_1_ < 4;
              refinerParams._54_1_ = refinerParams._54_1_ + '\x01') {
            if ((results.m_pSelectors._1_1_ & 1) == 0) {
              bVar2 = *(byte *)((long)&g_dxt1_to_linear + (ulong)(byte)refinerParams._54_1_);
            }
            else {
              bVar2 = 3 - *(char *)((long)&g_dxt1_to_linear + (ulong)(byte)refinerParams._54_1_);
            }
            uVar6 = crnlib::color::color_distance
                              ((bool)((this->m_params).m_perceptual & 1),
                               this->m_blocks[uVar4] + uStack_acc,(color_quad_u8 *)(&c + bVar2),
                               false);
            if (uVar6 < error) {
              refinerParams._55_1_ = bVar2;
              error = uVar6;
            }
          }
          error_best = error_best << 2 | (uint)(byte)refinerParams._55_1_;
        }
        puVar11 = vector<unsigned_long_long>::operator[](this->m_block_selectors,uVar4);
        *puVar11 = CONCAT44(error_best,(int)(long)((float)uVar5 * fVar12));
      }
      dxt_endpoint_refiner::params::params((params *)&refinerResults.m_error);
      vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_9f8);
      vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&this_00->pixels);
      vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
      refinerResults.m_error._0_4_ = cluster._4_4_;
      bVar1 = dxt_endpoint_refiner::refine
                        ((dxt_endpoint_refiner *)local_9d8,(params *)&refinerResults.m_error,
                         (results *)local_b20);
      if (bVar1) {
        this_00->first_endpoint = (uint)(ushort)local_b20._0_2_;
        this_00->second_endpoint = (uint)(ushort)local_b20._2_2_;
      }
    }
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)local_9f8);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer((dxt1_endpoint_optimizer *)&refiner.m_pResults);
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt1_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_color_clusters.size(); cluster_index += num_tasks)
        {
            color_cluster& cluster = m_color_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt1_endpoint_optimizer::params params;
            params.m_block_index = cluster_index;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_pixels_have_alpha = false;
            params.m_use_alpha_blocks = false;
            params.m_perceptual = m_params.m_perceptual;
            params.m_quality = cCRNDXTQualityUber;
            params.m_endpoint_caching = false;

            dxt1_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_low_color;
            cluster.second_endpoint = results.m_high_color;
            color_quad_u8 block_values[4], color_values[4];
            dxt1_block::get_block_colors4(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 4; i++)
            {
                color_values[i] = cluster.color_values[i] = block_values[g_dxt1_from_linear[i]];
            }
            for (uint c = 0; results.m_alternate_rounding && c < 3; c++)
            {
                color_values[1].c[c] = ((color_values[0].c[c] << 1) + color_values[3].c[c] + 1) / 3;
                color_values[2].c[c] = ((color_values[3].c[c] << 1) + color_values[0].c[c] + 1) / 3;
            }

            uint endpoint_weight = color::color_distance(m_params.m_perceptual, color_values[0], color_values[3], false) / 2000;
            float encoding_weight[8];
            for (uint i = 0; i < 8; i++)
            {
                encoding_weight[i] = math::lerp(1.15f, 1.0f, i / 7.0f);
            }

            crnlib::vector<uint>& blocks = cluster.blocks[cColor];
            for (uint i = 0; i < blocks.size(); i++)
            {
                uint b = blocks[i];
                uint weight = (uint)(math::clamp<uint>(endpoint_weight * m_block_weights[b], 1, 2048) * encoding_weight[m_block_encodings[b]]);
                uint32 selector = 0;
                for (uint p = 0; p < 16; p++)
                {
                    uint error_best = cUINT32_MAX;
                    uint8 s_best = 0;
                    for (uint8 t = 0; t < 4; t++)
                    {
                        uint8 s = results.m_reordered ? 3 - g_dxt1_to_linear[t] : g_dxt1_to_linear[t];
                        uint error = color::color_distance(m_params.m_perceptual, (color_quad_u8&)m_blocks[b][p], color_values[s], false);
                        if (error < error_best)
                        {
                            s_best = s;
                            error_best = error;
                        }
                    }
                    selector = selector << 2 | s_best;
                }
                m_block_selectors[cColor][b] = (uint64)selector << 32 | weight;
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = true;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            if (refiner.refine(refinerParams, refinerResults))
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
            }
        }
    }